

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common.h
# Opt level: O0

void __thiscall
TestSuite::Displayer::setWidth
          (Displayer *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *src)

{
  value_type vVar1;
  size_type sVar2;
  reference pvVar3;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RSI;
  long in_RDI;
  size_t ii_1;
  size_t ii;
  size_t num_src;
  undefined8 local_28;
  undefined8 local_20;
  
  sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(in_RSI);
  if (sVar2 != 0) {
    for (local_20 = 0; local_28 = sVar2, local_20 < sVar2; local_20 = local_20 + 1) {
      pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (in_RSI,local_20);
      vVar1 = *pvVar3;
      pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x10),
                          local_20);
      *pvVar3 = vVar1;
    }
    for (; local_28 < *(ulong *)(in_RDI + 8); local_28 = local_28 + 1) {
      pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (in_RSI,sVar2 - 1);
      vVar1 = *pvVar3;
      pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x10),
                          local_28);
      *pvVar3 = vVar1;
    }
  }
  return;
}

Assistant:

void setWidth(std::vector<size_t>& src) {
            size_t num_src = src.size();
            if (!num_src) return;

            for (size_t ii=0; ii<num_src; ++ii) {
                colWidth[ii] = src[ii];
            }
            for (size_t ii=num_src; ii<numCols; ++ii) {
                colWidth[ii] = src[num_src-1];
            }
        }